

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O0

bool __thiscall gmlc::concurrency::TriggerVariable::activate(TriggerVariable *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> lock_1;
  undefined4 in_stack_ffffffffffffffe0;
  memory_order in_stack_ffffffffffffffe4;
  atomic<bool> *in_stack_ffffffffffffffe8;
  bool local_1;
  
  local_1 = CLI::std::atomic<bool>::load(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  if (!local_1) {
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               SUB81((ulong)in_RDI >> 0x38,0));
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4cece4);
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               SUB81((ulong)in_RDI >> 0x38,0));
    std::condition_variable::notify_all();
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4ced27);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool activate()
    {
        if (activated.load()) {
            return false;
        }
        {
            std::lock_guard<std::mutex> lock(triggerLock);
            triggered = false;
        }
        std::lock_guard<std::mutex> lock(activeLock);
        activated = true;
        cv_active.notify_all();
        return true;
    }